

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmConditional(ExpressionContext *ctx,VmModule *module,ExprConditional *node)

{
  SynBase *source;
  VmValue *pVVar1;
  VmBlock *block;
  VmBlock *block_00;
  VmBlock *block_01;
  VmConstant *pVVar2;
  VmInstruction *valueA;
  VmInstruction *valueB;
  VmValue *phi;
  VmConstant *constant_1;
  VmValue *falseValue;
  VmConstant *constant;
  VmValue *trueValue;
  VmConstant *tempAddress;
  VmBlock *exitBlock;
  VmBlock *falseBlock;
  VmBlock *trueBlock;
  VmValue *condition;
  ExprConditional *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar1 = CompileVm(ctx,module,node->condition);
  block = anon_unknown.dwarf_1a3010::CreateBlock(module,(node->super_ExprBase).source,"if_true");
  block_00 = anon_unknown.dwarf_1a3010::CreateBlock(module,(node->super_ExprBase).source,"if_false")
  ;
  block_01 = anon_unknown.dwarf_1a3010::CreateBlock(module,(node->super_ExprBase).source,"if_exit");
  anon_unknown.dwarf_1a3010::CreateJumpNotZero
            (module,(node->super_ExprBase).source,pVVar1,&block->super_VmValue,
             &block_00->super_VmValue);
  if (node->trueBlock->type != node->falseBlock->type) {
    __assert_fail("node->trueBlock->type == node->falseBlock->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xbf4,
                  "VmValue *CompileVmConditional(ExpressionContext &, VmModule *, ExprConditional *)"
                 );
  }
  VmFunction::AddBlock(module->currentFunction,block);
  module->currentBlock = block;
  trueValue = (VmValue *)0x0;
  constant = (VmConstant *)CompileVm(ctx,module,node->trueBlock);
  pVVar2 = getType<VmConstant>((VmValue *)constant);
  if (pVVar2 != (VmConstant *)0x0) {
    if ((pVVar2->super_VmValue).type.type == VM_TYPE_STRUCT) {
      trueValue = &anon_unknown.dwarf_1a3010::CreateAlloca
                             (ctx,module,(node->super_ExprBase).source,node->trueBlock->type,"cond",
                              true)->super_VmValue;
      anon_unknown.dwarf_1a3010::CreateStore
                (ctx,module,(node->super_ExprBase).source,node->trueBlock->type,trueValue,
                 &pVVar2->super_VmValue,0);
    }
    else {
      constant = (VmConstant *)
                 anon_unknown.dwarf_1a3010::CreateLoadImmediate
                           (module,(node->super_ExprBase).source,pVVar2);
    }
  }
  anon_unknown.dwarf_1a3010::CreateJump
            (module,(node->super_ExprBase).source,&block_01->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block_00);
  module->currentBlock = block_00;
  constant_1 = (VmConstant *)CompileVm(ctx,module,node->falseBlock);
  pVVar2 = getType<VmConstant>((VmValue *)constant_1);
  if (pVVar2 != (VmConstant *)0x0) {
    if ((pVVar2->super_VmValue).type.type == VM_TYPE_STRUCT) {
      if (trueValue == (VmValue *)0x0) {
        __assert_fail("tempAddress",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0xc16,
                      "VmValue *CompileVmConditional(ExpressionContext &, VmModule *, ExprConditional *)"
                     );
      }
      anon_unknown.dwarf_1a3010::CreateStore
                (ctx,module,(node->super_ExprBase).source,node->falseBlock->type,trueValue,
                 &pVVar2->super_VmValue,0);
    }
    else {
      constant_1 = (VmConstant *)
                   anon_unknown.dwarf_1a3010::CreateLoadImmediate
                             (module,(node->super_ExprBase).source,pVVar2);
    }
  }
  anon_unknown.dwarf_1a3010::CreateJump
            (module,(node->super_ExprBase).source,&block_01->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block_01);
  module->currentBlock = block_01;
  if (trueValue == (VmValue *)0x0) {
    if (((node->super_ExprBase).type)->size == 0) {
      ctx_local = (ExpressionContext *)
                  CreateConstantStruct
                            (ctx->allocator,(node->super_ExprBase).source,(char *)0x0,0,
                             (node->super_ExprBase).type);
    }
    else {
      source = (node->super_ExprBase).source;
      valueA = getType<VmInstruction>(&constant->super_VmValue);
      valueB = getType<VmInstruction>(&constant_1->super_VmValue);
      pVVar1 = anon_unknown.dwarf_1a3010::CreatePhi(module,source,valueA,valueB);
      ctx_local = (ExpressionContext *)
                  anon_unknown.dwarf_1a3010::CheckType(ctx,&node->super_ExprBase,pVVar1);
    }
  }
  else {
    pVVar1 = anon_unknown.dwarf_1a3010::CreateLoad
                       (ctx,module,(node->super_ExprBase).source,node->falseBlock->type,trueValue,0)
    ;
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_1a3010::CheckType(ctx,&node->super_ExprBase,pVVar1);
  }
  return (VmValue *)ctx_local;
}

Assistant:

VmValue* CompileVmConditional(ExpressionContext &ctx, VmModule *module, ExprConditional *node)
{
	VmValue* condition = CompileVm(ctx, module, node->condition);

	VmBlock *trueBlock = CreateBlock(module, node->source, "if_true");
	VmBlock *falseBlock = CreateBlock(module, node->source, "if_false");
	VmBlock *exitBlock = CreateBlock(module, node->source, "if_exit");

	CreateJumpNotZero(module, node->source, condition, trueBlock, falseBlock);

	assert(node->trueBlock->type == node->falseBlock->type);

	module->currentFunction->AddBlock(trueBlock);
	module->currentBlock = trueBlock;

	VmConstant *tempAddress = NULL;

	VmValue *trueValue = CompileVm(ctx, module, node->trueBlock);

	if(VmConstant *constant = getType<VmConstant>(trueValue))
	{
		if(constant->type.type == VM_TYPE_STRUCT)
		{
			tempAddress = CreateAlloca(ctx, module, node->source, node->trueBlock->type, "cond", true);

			CreateStore(ctx, module, node->source, node->trueBlock->type, tempAddress, constant, 0);
		}
		else
		{
			trueValue = CreateLoadImmediate(module, node->source, constant);
		}
	}

	CreateJump(module, node->source, exitBlock);

	module->currentFunction->AddBlock(falseBlock);
	module->currentBlock = falseBlock;

	VmValue *falseValue = CompileVm(ctx, module, node->falseBlock);

	if(VmConstant *constant = getType<VmConstant>(falseValue))
	{
		if(constant->type.type == VM_TYPE_STRUCT)
		{
			assert(tempAddress);

			CreateStore(ctx, module, node->source, node->falseBlock->type, tempAddress, constant, 0);
		}
		else
		{
			falseValue = CreateLoadImmediate(module, node->source, constant);
		}
	}

	CreateJump(module, node->source, exitBlock);

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	if(tempAddress)
		return CheckType(ctx, node, CreateLoad(ctx, module, node->source, node->falseBlock->type, tempAddress, 0));

	if(node->type->size == 0)
		return CreateConstantStruct(ctx.allocator, node->source, NULL, 0, node->type);

	VmValue *phi = CreatePhi(module, node->source, getType<VmInstruction>(trueValue), getType<VmInstruction>(falseValue));

	return CheckType(ctx, node, phi);
}